

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# student.h
# Opt level: O0

int __thiscall
CP::priority_queue<int,_std::less<int>_>::find_level
          (priority_queue<int,_std::less<int>_> *this,int k)

{
  double local_28;
  int local_18;
  int i;
  int k_local;
  priority_queue<int,_std::less<int>_> *this_local;
  
  local_18 = (int)this->mSize;
  do {
    local_18 = local_18 + -1;
    if (local_18 < 0) break;
  } while (this->mData[local_18] != k);
  if (local_18 == 0) {
    local_28 = 0.0;
  }
  else {
    local_28 = log2((double)local_18);
  }
  return (int)local_28;
}

Assistant:

int CP::priority_queue<T, C>::find_level(T k) const {
    int i = mSize - 1;
    for (; i >= 0; --i) {
        if (mData[i] == k) {
            break;
        }
    }
    return i == 0 ? i : log2(i);
}